

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O2

int __thiscall
CConsole::RegisterPrintCallback
          (CConsole *this,int OutputLevel,FPrintCallback pfnPrintCallback,void *pUserData)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  
  iVar1 = this->m_NumPrintCB;
  lVar2 = (long)iVar1;
  if (lVar2 == 4) {
    return -1;
  }
  iVar3 = 2;
  if ((uint)OutputLevel < 2) {
    iVar3 = OutputLevel;
  }
  iVar4 = 0;
  if (-1 < OutputLevel) {
    iVar4 = iVar3;
  }
  this->m_aPrintCB[lVar2].m_OutputLevel = iVar4;
  this->m_aPrintCB[lVar2].m_pfnPrintCallback = pfnPrintCallback;
  this->m_aPrintCB[lVar2].m_pPrintCallbackUserdata = pUserData;
  this->m_NumPrintCB = iVar1 + 1;
  return iVar1;
}

Assistant:

int CConsole::RegisterPrintCallback(int OutputLevel, FPrintCallback pfnPrintCallback, void *pUserData)
{
	if(m_NumPrintCB == MAX_PRINT_CB)
		return -1;

	m_aPrintCB[m_NumPrintCB].m_OutputLevel = clamp(OutputLevel, (int)(OUTPUT_LEVEL_STANDARD), (int)(OUTPUT_LEVEL_DEBUG));
	m_aPrintCB[m_NumPrintCB].m_pfnPrintCallback = pfnPrintCallback;
	m_aPrintCB[m_NumPrintCB].m_pPrintCallbackUserdata = pUserData;
	return m_NumPrintCB++;
}